

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::Builtins::registerMiscSystemFuncs(Builtins *this)

{
  bool local_da;
  undefined1 local_d9;
  InferredValueFunction *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  KnownSystemName local_bc;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  shared_ptr<slang::ast::SystemSubroutine> local_38;
  shared_ptr<slang::ast::SystemSubroutine> local_28;
  
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ValuePlusArgsFunction,std::allocator<slang::ast::builtins::ValuePlusArgsFunction>>
            (a_Stack_d0,(ValuePlusArgsFunction **)&local_d8,
             (allocator<slang::ast::builtins::ValuePlusArgsFunction> *)&local_bc);
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_28);
  if (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ScopeRandomizeFunction,std::allocator<slang::ast::builtins::ScopeRandomizeFunction>>
            (a_Stack_d0,(ScopeRandomizeFunction **)&local_d8,
             (allocator<slang::ast::builtins::ScopeRandomizeFunction> *)&local_bc);
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_38);
  if (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::GlobalClockFunction,std::allocator<slang::ast::builtins::GlobalClockFunction>>
            (a_Stack_d0,(GlobalClockFunction **)&local_d8,
             (allocator<slang::ast::builtins::GlobalClockFunction> *)&local_bc);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = SFormatF;
  local_da = false;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SFormatFunction,std::allocator<slang::ast::builtins::SFormatFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,(SFormatFunction **)&local_d8,
             (allocator<slang::ast::builtins::SFormatFunction> *)&local_d9,&local_bc,&local_da);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = PSPrintF;
  local_da = true;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SFormatFunction,std::allocator<slang::ast::builtins::SFormatFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,(SFormatFunction **)&local_d8,
             (allocator<slang::ast::builtins::SFormatFunction> *)&local_d9,&local_bc,&local_da);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = InferredClock;
  local_da = true;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::InferredValueFunction,std::allocator<slang::ast::builtins::InferredValueFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,&local_d8,
             (allocator<slang::ast::builtins::InferredValueFunction> *)&local_d9,&local_bc,&local_da
            );
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = InferredDisable;
  local_da = false;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::InferredValueFunction,std::allocator<slang::ast::builtins::InferredValueFunction>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,&local_d8,
             (allocator<slang::ast::builtins::InferredValueFunction> *)&local_d9,&local_bc,&local_da
            );
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ClassRandomizeFunction,std::allocator<slang::ast::builtins::ClassRandomizeFunction>>
            (a_Stack_d0,(ClassRandomizeFunction **)&local_d8,
             (allocator<slang::ast::builtins::ClassRandomizeFunction> *)&local_bc);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,ClassType,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = Triggered;
  local_da = false;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SequenceMethod,std::allocator<slang::ast::builtins::SequenceMethod>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,(SequenceMethod **)&local_d8,
             (allocator<slang::ast::builtins::SequenceMethod> *)&local_d9,&local_bc,&local_da);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,SequenceType,&local_a8);
  if (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  local_bc = Matched;
  local_da = true;
  local_d8 = (InferredValueFunction *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::SequenceMethod,std::allocator<slang::ast::builtins::SequenceMethod>,slang::parsing::KnownSystemName,bool>
            (a_Stack_d0,(SequenceMethod **)&local_d8,
             (allocator<slang::ast::builtins::SequenceMethod> *)&local_d9,&local_bc,&local_da);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_d8->super_SystemSubroutine;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = a_Stack_d0[0]._M_pi;
  local_d8 = (InferredValueFunction *)0x0;
  a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemMethod(this,SequenceType,&local_b8);
  if (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
  }
  return;
}

Assistant:

void Builtins::registerMiscSystemFuncs() {
    using parsing::KnownSystemName;

#define REGISTER(name) addSystemSubroutine(std::make_shared<name##Function>())
    REGISTER(ValuePlusArgs);
    REGISTER(ScopeRandomize);
    REGISTER(GlobalClock);
#undef REGISTER

    addSystemSubroutine(std::make_shared<SFormatFunction>(KnownSystemName::SFormatF, false));
    addSystemSubroutine(std::make_shared<SFormatFunction>(KnownSystemName::PSPrintF, true));

    addSystemSubroutine(
        std::make_shared<InferredValueFunction>(KnownSystemName::InferredClock, true));
    addSystemSubroutine(
        std::make_shared<InferredValueFunction>(KnownSystemName::InferredDisable, false));

    addSystemMethod(SymbolKind::ClassType, std::make_shared<ClassRandomizeFunction>());
    addSystemMethod(SymbolKind::SequenceType,
                    std::make_shared<SequenceMethod>(KnownSystemName::Triggered, false));
    addSystemMethod(SymbolKind::SequenceType,
                    std::make_shared<SequenceMethod>(KnownSystemName::Matched, true));
}